

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestBuildCommand.cxx
# Opt level: O0

void __thiscall cmCTestBuildCommand::cmCTestBuildCommand(cmCTestBuildCommand *this)

{
  reference ppcVar1;
  cmCTestBuildCommand *this_local;
  
  cmCTestHandlerCommand::cmCTestHandlerCommand(&this->super_cmCTestHandlerCommand);
  (this->super_cmCTestHandlerCommand).super_cmCTestCommand.super_cmCommand._vptr_cmCommand =
       (_func_int **)&PTR__cmCTestBuildCommand_00d9d498;
  this->GlobalGenerator = (cmGlobalGenerator *)0x0;
  ppcVar1 = std::vector<const_char_*,_std::allocator<const_char_*>_>::operator[]
                      (&(this->super_cmCTestHandlerCommand).Arguments,7);
  *ppcVar1 = "NUMBER_ERRORS";
  ppcVar1 = std::vector<const_char_*,_std::allocator<const_char_*>_>::operator[]
                      (&(this->super_cmCTestHandlerCommand).Arguments,8);
  *ppcVar1 = "NUMBER_WARNINGS";
  ppcVar1 = std::vector<const_char_*,_std::allocator<const_char_*>_>::operator[]
                      (&(this->super_cmCTestHandlerCommand).Arguments,9);
  *ppcVar1 = "TARGET";
  ppcVar1 = std::vector<const_char_*,_std::allocator<const_char_*>_>::operator[]
                      (&(this->super_cmCTestHandlerCommand).Arguments,10);
  *ppcVar1 = "CONFIGURATION";
  ppcVar1 = std::vector<const_char_*,_std::allocator<const_char_*>_>::operator[]
                      (&(this->super_cmCTestHandlerCommand).Arguments,0xb);
  *ppcVar1 = "FLAGS";
  ppcVar1 = std::vector<const_char_*,_std::allocator<const_char_*>_>::operator[]
                      (&(this->super_cmCTestHandlerCommand).Arguments,0xc);
  *ppcVar1 = "PROJECT_NAME";
  ppcVar1 = std::vector<const_char_*,_std::allocator<const_char_*>_>::operator[]
                      (&(this->super_cmCTestHandlerCommand).Arguments,0xd);
  *ppcVar1 = (value_type)0x0;
  (this->super_cmCTestHandlerCommand).Last = 0xd;
  return;
}

Assistant:

cmCTestBuildCommand::cmCTestBuildCommand()
{
  this->GlobalGenerator = CM_NULLPTR;
  this->Arguments[ctb_NUMBER_ERRORS] = "NUMBER_ERRORS";
  this->Arguments[ctb_NUMBER_WARNINGS] = "NUMBER_WARNINGS";
  this->Arguments[ctb_TARGET] = "TARGET";
  this->Arguments[ctb_CONFIGURATION] = "CONFIGURATION";
  this->Arguments[ctb_FLAGS] = "FLAGS";
  this->Arguments[ctb_PROJECT_NAME] = "PROJECT_NAME";
  this->Arguments[ctb_LAST] = CM_NULLPTR;
  this->Last = ctb_LAST;
}